

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_source.cpp
# Opt level: O3

string * __thiscall
address_source::address_abi_cxx11_(string *__return_storage_ptr__,address_source *this)

{
  ostream *poVar1;
  stringstream ss;
  char local_199;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,this->cur_[0]);
  local_199 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[1]);
  local_199 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[2]);
  local_199 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  std::ostream::operator<<(poVar1,this->cur_[3]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string
address_source::address() const
{
    std::stringstream ss{};
    ss << cur_[0] << '.' << cur_[1] << '.' << cur_[2] << '.' << cur_[3];
    return ss.str();
}